

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* nivalis::OpCode::constant_value_map_abi_cxx11_(void)

{
  int iVar1;
  mapped_type_conflict *pmVar2;
  allocator<char> local_29;
  key_type local_28;
  
  if (constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_);
    if (iVar1 != 0) {
      constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_header._M_color = _S_red;
      constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_header._M_parent = (_Base_ptr)0x0;
      constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_header._M_left =
           &constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_header._M_right =
           &constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_node_count = 0;
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::~map,&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_);
    }
  }
  if (constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ._M_node_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"pi",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&local_28);
    *pmVar2 = 3.141592653589793;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"e",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&local_28);
    *pmVar2 = 2.718281828459045;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"phi",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&local_28);
    *pmVar2 = 1.618033988749895;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"euler",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&local_28);
    *pmVar2 = 0.5772156649015329;
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"nan",&local_29);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_,&local_28);
    *pmVar2 = NAN;
    std::__cxx11::string::~string((string *)&local_28);
  }
  return &constant_value_map[abi:cxx11]()::constant_values_abi_cxx11_;
}

Assistant:

const std::map<std::string, double>& constant_value_map() {
    static std::map<std::string, double> constant_values;
    if (constant_values.empty()){
        // Set lookup tables
        constant_values["pi"] = M_PI;
        constant_values["e"] =  M_E;
        constant_values["phi"] = 0.5 * (1. + sqrt(5)); // golden ratio
        constant_values["euler"] = 0.577215664901532860606; // Euler-Mascheroni

        constant_values["nan"] = std::numeric_limits<double>::quiet_NaN();
    }
    return constant_values;
}